

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websockets.c
# Opt level: O0

buffer_s resize_ws_buffer(ws_s *owner,buffer_s buff)

{
  buffer_s buff_00;
  buffer_s bVar1;
  void *pvVar2;
  void *tmp;
  ws_s *owner_local;
  buffer_s buff_local;
  
  buff_local.data = (void *)(((buff.size >> 0xc) + 1) * 0x1000);
  pvVar2 = realloc(buff.data,(size_t)buff_local.data);
  if (pvVar2 == (void *)0x0) {
    buff_00.size = (size_t)buff_local.data;
    buff_00.data = buff.data;
    free_ws_buffer(owner,buff_00);
    buff_local.data = (void *)0x0;
  }
  bVar1.size = (size_t)buff_local.data;
  bVar1.data = pvVar2;
  return bVar1;
}

Assistant:

struct buffer_s resize_ws_buffer(ws_s *owner, struct buffer_s buff) {
  buff.size = round_up_buffer_size(buff.size);
  void *tmp = realloc(buff.data, buff.size);
  if (!tmp) {
    free_ws_buffer(owner, buff);
    buff.data = NULL;
    buff.size = 0;
  }
  buff.data = tmp;
  return buff;
}